

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryCompressedTTF
          (ImFontAtlas *this,void *compressed_ttf_data,int compressed_ttf_size,float size_pixels,
          ImFontConfig *font_cfg_template,ImWchar *glyph_ranges)

{
  byte bVar1;
  uint uVar2;
  uchar *puVar3;
  ImFont *pIVar4;
  uchar *puVar5;
  ushort *puVar6;
  uint uVar7;
  ushort *puVar8;
  ulong uVar9;
  uint uVar10;
  ImFontConfig font_cfg;
  ImFontConfig local_140;
  ImFontConfig local_b8;
  
  uVar2 = *(uint *)((long)compressed_ttf_data + 8);
  uVar10 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  puVar3 = (uchar *)ImGui::MemAlloc((ulong)uVar10);
  uVar2 = *compressed_ttf_data;
  if (((uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) ==
       0x57bc0000) &&
     (uVar2 = *(uint *)((long)compressed_ttf_data + 4),
     ((uVar2 >> 0x18 == 0 && (uVar2 & 0xff0000) == 0) && (uVar2 & 0xff00) == 0) &&
     (uVar2 & 0xff) == 0)) {
    uVar2 = *(uint *)((long)compressed_ttf_data + 8);
    puVar8 = (ushort *)((long)compressed_ttf_data + 0x10);
    stb__barrier_in_b = (uchar *)compressed_ttf_data;
    stb__barrier_out_e =
         puVar3 + (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18);
    stb__barrier_out_b = puVar3;
    stb__dout = puVar3;
    do {
      bVar1 = (byte)*puVar8;
      uVar7 = (uint)bVar1;
      if (bVar1 < 0x20) {
        if (bVar1 < 0x18) {
          if (bVar1 < 0x10) {
            if (bVar1 < 8) {
              if (bVar1 == 4) {
                stb__match(stb__dout +
                           ~((ulong)*(byte *)((long)puVar8 + 3) |
                             (ulong)*(byte *)((long)puVar8 + 1) << 0x10 |
                            (ulong)(byte)puVar8[1] << 8),
                           (ushort)(puVar8[2] << 8 | puVar8[2] >> 8) + 1);
                puVar6 = puVar8 + 3;
              }
              else {
                if (uVar7 == 6) {
                  uVar9 = ~((ulong)*(byte *)((long)puVar8 + 3) |
                            (ulong)*(byte *)((long)puVar8 + 1) << 0x10 | (ulong)(byte)puVar8[1] << 8
                           );
                  uVar7 = (uint)(byte)puVar8[2];
                  goto LAB_0013682a;
                }
                puVar6 = puVar8;
                if (uVar7 == 7) {
                  uVar9 = (ulong)(ushort)(*(ushort *)((long)puVar8 + 1) << 8 |
                                         *(ushort *)((long)puVar8 + 1) >> 8);
                  puVar5 = stb__dout + uVar9 + 1;
                  if (puVar5 <= stb__barrier_out_e) {
                    if ((byte *)((long)puVar8 + 3) < stb__barrier_in_b) {
                      puVar5 = stb__barrier_out_e + 1;
                    }
                    else {
                      memcpy(stb__dout,(byte *)((long)puVar8 + 3),uVar9 + 1);
                    }
                  }
                  puVar6 = (ushort *)
                           ((long)puVar8 +
                           (ulong)(ushort)(*(ushort *)((long)puVar8 + 1) << 8 |
                                          *(ushort *)((long)puVar8 + 1) >> 8) + 4);
                  stb__dout = puVar5;
                }
              }
            }
            else {
              uVar9 = (ulong)(((uint)bVar1 * 0x100 + (uint)*(byte *)((long)puVar8 + 1)) - 0x7ff);
              puVar5 = stb__dout + uVar9;
              if (puVar5 <= stb__barrier_out_e) {
                if (puVar8 + 1 < stb__barrier_in_b) {
                  puVar5 = stb__barrier_out_e + 1;
                }
                else {
                  memcpy(stb__dout,puVar8 + 1,uVar9);
                }
              }
              puVar6 = (ushort *)
                       ((long)puVar8 + ((ulong)(ushort)(*puVar8 << 8 | *puVar8 >> 8) - 0x7fd));
              stb__dout = puVar5;
            }
          }
          else {
            uVar9 = -(ulong)(((uint)*(byte *)((long)puVar8 + 1) * 0x100 +
                             ((uint)(byte)puVar8[1] | (uint)bVar1 << 0x10)) - 0xfffff);
            uVar7 = (uint)(ushort)(*(ushort *)((long)puVar8 + 3) << 8 |
                                  *(ushort *)((long)puVar8 + 3) >> 8);
LAB_0013682a:
            stb__match(stb__dout + uVar9,uVar7 + 1);
            puVar6 = (ushort *)((long)puVar8 + 5);
          }
        }
        else {
          stb__match(stb__dout +
                     -(ulong)(((uint)*(byte *)((long)puVar8 + 1) * 0x100 +
                              ((uint)(byte)puVar8[1] | (uint)bVar1 << 0x10)) - 0x17ffff),
                     *(byte *)((long)puVar8 + 3) + 1);
          puVar6 = puVar8 + 2;
        }
      }
      else if ((char)bVar1 < '\0') {
        stb__match(stb__dout + ~(ulong)*(byte *)((long)puVar8 + 1),uVar7 - 0x7f);
        puVar6 = puVar8 + 1;
      }
      else if (bVar1 < 0x40) {
        puVar5 = stb__dout + (uVar7 - 0x1f);
        if (puVar5 <= stb__barrier_out_e) {
          if ((byte *)((long)puVar8 + 1) < stb__barrier_in_b) {
            puVar5 = stb__barrier_out_e + 1;
          }
          else {
            memcpy(stb__dout,(byte *)((long)puVar8 + 1),(ulong)(uVar7 - 0x1f));
          }
        }
        puVar6 = (ushort *)((long)puVar8 + ((ulong)(byte)*puVar8 - 0x1e));
        stb__dout = puVar5;
      }
      else {
        stb__match(stb__dout +
                   -(ulong)(((uint)*(byte *)((long)puVar8 + 1) + (uint)bVar1 * 0x100) - 0x3fff),
                   (byte)puVar8[1] + 1);
        puVar6 = (ushort *)((long)puVar8 + 3);
      }
    } while ((puVar6 != puVar8) &&
            (puVar8 = puVar6,
            stb__dout <=
            puVar3 + (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                     uVar2 << 0x18)));
  }
  if (font_cfg_template == (ImFontConfig *)0x0) {
    ImFontConfig::ImFontConfig(&local_140);
  }
  else {
    memcpy(&local_140,font_cfg_template,0x88);
  }
  local_140.FontDataOwnedByAtlas = true;
  memcpy(&local_b8,&local_140,0x88);
  if (glyph_ranges != (ImWchar *)0x0) {
    local_b8.GlyphRanges = glyph_ranges;
  }
  local_b8.FontData = puVar3;
  local_b8.FontDataSize = uVar10;
  local_b8.SizePixels = size_pixels;
  pIVar4 = AddFont(this,&local_b8);
  return pIVar4;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryCompressedTTF(const void* compressed_ttf_data, int compressed_ttf_size, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    const unsigned int buf_decompressed_size = stb_decompress_length((const unsigned char*)compressed_ttf_data);
    unsigned char* buf_decompressed_data = (unsigned char*)IM_ALLOC(buf_decompressed_size);
    stb_decompress(buf_decompressed_data, (const unsigned char*)compressed_ttf_data, (unsigned int)compressed_ttf_size);

    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    IM_ASSERT(font_cfg.FontData == NULL);
    font_cfg.FontDataOwnedByAtlas = true;
    return AddFontFromMemoryTTF(buf_decompressed_data, (int)buf_decompressed_size, size_pixels, &font_cfg, glyph_ranges);
}